

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O3

bool embree::avx::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  long *plVar4;
  long lVar5;
  float fVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  float fVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  _func_int *p_Var16;
  float fVar17;
  vfloat4 a0_1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM0 [64];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vfloat4 a0;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_ZMM4 [64];
  float fVar75;
  vfloat4 b0;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 in_ZMM5 [64];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 in_ZMM6 [64];
  float fVar88;
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 in_ZMM7 [64];
  float fVar93;
  float fVar95;
  vfloat4 a1;
  undefined1 auVar94 [16];
  undefined1 in_ZMM9 [64];
  float fVar96;
  RayQueryContext newcontext;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  uint uStack_120;
  uint uStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_d8 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar31 = in_ZMM7._0_16_;
  auVar39 = in_ZMM6._0_16_;
  a0.field_0 = in_ZMM4._0_16_;
  auVar38 = in_ZMM2._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  auVar30 = in_ZMM9._0_16_;
  a0_1.field_0 = in_ZMM0._0_16_;
  auVar45 = in_ZMM1._0_16_;
  uVar10 = prim->primID_;
  pGVar2 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var16 = *(_func_int **)&pGVar2->field_0x58;
  if ((((p_Var16 == (_func_int *)0x0) &&
       ((uVar11 = (ulong)*(uint *)(*(long *)&pGVar2[1].time_range.upper +
                                  (long)pGVar2[1].intersectionFilterN * (ulong)uVar10),
        uVar11 == 0xffffffff ||
        (p_Var16 = pGVar2[1].super_RefCount._vptr_RefCount[uVar11], p_Var16 == (_func_int *)0x0))))
      || ((ray->mask & pGVar2->mask) == 0)) ||
     (pRVar3 = context->user, pRVar3->instID[0] != 0xffffffff)) {
    return false;
  }
  pRVar3->instID[0] = prim->instID_;
  pRVar3->instPrimID[0] = uVar10;
  uVar11 = (ulong)prim->primID_;
  if (pGVar2->numTimeSteps == 1) {
    plVar4 = *(long **)&pGVar2[1].fnumTimeSegments;
    iVar1 = (int)plVar4[4];
    if ((pGVar2->field_8).field_0x1 != '\x01') {
      if (iVar1 == 0x9134) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar12)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar12)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar12)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),0x1c);
        auVar38 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar12)),0x28);
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar12)),0x1c);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar12)),0x28);
      }
      else if (iVar1 == 0x9234) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(lVar5 + 4 + lVar12);
        auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar18,0x4c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar45,auVar45,0x78);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
        auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),auVar41,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar45,auVar45,0x78);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
        auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar42,0x4c);
        auVar38 = vshufps_avx(auVar45,auVar45,0x78);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar12);
        auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),auVar43,0x4c);
        auVar45 = vshufps_avx(auVar45,auVar45,0x78);
      }
      else if (iVar1 == 0xb001) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
        auVar39 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),0x20);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar12);
        auVar45 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar21);
        auVar31 = vshufps_avx(auVar45,auVar21,0xd8);
        auVar66._8_8_ = 0;
        auVar66._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
        auVar45 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar66);
        auVar38 = vshufps_avx(auVar45,auVar66,0xd8);
        fVar40 = *(float *)(lVar5 + 0x24 + lVar12);
        fVar88 = *(float *)(lVar5 + 0x28 + lVar12);
        fVar82 = *(float *)(lVar5 + 0x2c + lVar12);
        fVar85 = *(float *)(lVar5 + 0x30 + lVar12);
        fVar90 = fVar85 * fVar85 + fVar82 * fVar82 + fVar40 * fVar40 + fVar88 * fVar88;
        auVar45 = vrsqrtss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
        fVar75 = auVar45._0_4_;
        fVar90 = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * fVar90 * -0.5;
        auVar45 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar90 * fVar40)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar31,ZEXT416((uint)(fVar90 * fVar88)),0x30);
        auVar31 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),0x10);
        auVar38 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar90 * fVar85)),0x30);
        auVar39 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar12)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar39,ZEXT416((uint)(fVar90 * fVar82)),0x30);
      }
      else if (iVar1 == 0x9244) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar12))->v;
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar12))->v;
        auVar38 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar12);
        auVar45 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar12);
      }
      goto LAB_004b1973;
    }
    if (iVar1 == 0x9134) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar12)),0x1c);
      auVar30 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar12)),0x28);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar12)),0x1c);
      auVar39 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),0x28);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),0x1c);
      auVar38 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar12)),0x28);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar12)),0x1c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar12)),0x28);
    }
    else if (iVar1 == 0x9234) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(lVar5 + 4 + lVar12);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar25,0x4c);
      auVar30 = vshufps_avx(auVar45,auVar45,0x78);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),auVar48,0x4c);
      auVar39 = vshufps_avx(auVar45,auVar45,0x78);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar49,0x4c);
      auVar38 = vshufps_avx(auVar45,auVar45,0x78);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar12);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),auVar50,0x4c);
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar45,auVar45,0x78);
    }
    else if (iVar1 == 0xb001) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
      auVar45 = vinsertps_avx(auVar28,ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),0x20);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar12);
      auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar29);
      auVar31 = vshufps_avx(auVar39,auVar29,0xd8);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
      auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar71);
      auVar38 = vshufps_avx(auVar39,auVar71,0xd8);
      fVar40 = *(float *)(lVar5 + 0x24 + lVar12);
      fVar88 = *(float *)(lVar5 + 0x28 + lVar12);
      fVar82 = *(float *)(lVar5 + 0x2c + lVar12);
      fVar85 = *(float *)(lVar5 + 0x30 + lVar12);
      fVar90 = fVar85 * fVar85 + fVar82 * fVar82 + fVar40 * fVar40 + fVar88 * fVar88;
      auVar39 = vrsqrtss_avx(ZEXT416((uint)fVar90),ZEXT416((uint)fVar90));
      fVar75 = auVar39._0_4_;
      fVar90 = fVar75 * 1.5 + fVar75 * fVar75 * fVar75 * fVar90 * -0.5;
      a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar38,ZEXT416((uint)(fVar90 * fVar40)),0x30);
      auVar30 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar90 * fVar88)),0x30);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),0x10);
      auVar38 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar90 * fVar85)),0x30);
      auVar45 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar12)),0x20);
      auVar39 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar90 * fVar82)),0x30);
    }
    else if (iVar1 == 0x9244) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      auVar30 = *(undefined1 (*) [16])(lVar5 + lVar12);
      auVar39 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar12);
      auVar38 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar12);
      a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x30 + lVar12);
    }
    auVar45 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
    auVar31 = vshufps_avx(auVar30,auVar30,0xff);
    auVar54 = vshufps_avx(auVar39,auVar39,0xff);
    auVar26 = vshufps_avx(auVar38,auVar38,0xff);
    fVar80 = auVar31._0_4_;
    fVar79 = auVar45._0_4_;
    fVar91 = auVar54._0_4_;
    fVar92 = auVar26._0_4_;
    fVar40 = fVar80 * fVar91 + fVar92 * fVar79;
    fVar85 = fVar80 * fVar91 - fVar92 * fVar79;
    fVar90 = fVar79 * fVar79 - fVar80 * fVar80;
    fVar75 = fVar80 * fVar92 - fVar91 * fVar79;
    fVar88 = fVar80 * fVar92 + fVar91 * fVar79;
    fVar82 = fVar91 * fVar92 + fVar80 * fVar79;
    fVar17 = fVar91 * fVar92 - fVar80 * fVar79;
    auVar45 = ZEXT416((uint)(-fVar92 * fVar92 + -fVar91 * fVar91 + fVar79 * fVar79 + fVar80 * fVar80
                            ));
    auVar45 = vshufps_avx(auVar45,auVar45,0);
    auVar31 = ZEXT416((uint)(fVar40 + fVar40));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    auVar54 = ZEXT416((uint)(fVar75 + fVar75));
    auVar54 = vshufps_avx(auVar54,auVar54,0);
    fVar75 = auVar45._0_4_ * 1.0 + auVar31._0_4_ * 0.0 + auVar54._0_4_ * 0.0;
    fVar79 = auVar45._4_4_ * 0.0 + auVar31._4_4_ * 1.0 + auVar54._4_4_ * 0.0;
    fVar80 = auVar45._8_4_ * 0.0 + auVar31._8_4_ * 0.0 + auVar54._8_4_ * 1.0;
    fVar81 = auVar45._12_4_ * 0.0 + auVar31._12_4_ * 0.0 + auVar54._12_4_ * 0.0;
    auVar45 = ZEXT416((uint)(-fVar92 * fVar92 + fVar91 * fVar91 + fVar90));
    auVar45 = vshufps_avx(auVar45,auVar45,0);
    auVar31 = ZEXT416((uint)(fVar82 + fVar82));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    auVar54 = ZEXT416((uint)(fVar85 + fVar85));
    auVar54 = vshufps_avx(auVar54,auVar54,0);
    fVar82 = auVar54._0_4_ * 1.0 + auVar45._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
    fVar85 = auVar54._4_4_ * 0.0 + auVar45._4_4_ * 1.0 + auVar31._4_4_ * 0.0;
    fVar86 = auVar54._8_4_ * 0.0 + auVar45._8_4_ * 0.0 + auVar31._8_4_ * 1.0;
    fVar87 = auVar54._12_4_ * 0.0 + auVar45._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
    auVar45 = ZEXT416((uint)(-fVar91 * fVar91 + fVar90 + fVar92 * fVar92));
    auVar31 = vshufps_avx(auVar45,auVar45,0);
    auVar45 = ZEXT416((uint)(fVar17 + fVar17));
    auVar54 = vshufps_avx(auVar45,auVar45,0);
    auVar45 = ZEXT416((uint)(fVar88 + fVar88));
    auVar26 = vshufps_avx(auVar45,auVar45,0);
    auVar45 = vshufps_avx(auVar30,ZEXT416(0) << 0x20,0xe9);
    auVar45 = vblendps_avx(auVar45,auVar39,4);
    fVar88 = auVar26._0_4_ * 1.0 + auVar54._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
    fVar90 = auVar26._4_4_ * 0.0 + auVar54._4_4_ * 1.0 + auVar31._4_4_ * 0.0;
    fVar91 = auVar26._8_4_ * 0.0 + auVar54._8_4_ * 0.0 + auVar31._8_4_ * 1.0;
    fVar92 = auVar26._12_4_ * 0.0 + auVar54._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
    fVar17 = auVar45._0_4_;
    fVar93 = auVar45._4_4_;
    fVar95 = auVar45._8_4_;
    fVar40 = auVar45._12_4_;
    auVar45 = vshufps_avx(auVar30,auVar30,0);
    aVar32._0_4_ = auVar45._0_4_ * fVar75 + fVar88 * 0.0 + fVar82 * 0.0;
    aVar32._4_4_ = auVar45._4_4_ * fVar79 + fVar90 * 0.0 + fVar85 * 0.0;
    aVar32._8_4_ = auVar45._8_4_ * fVar80 + fVar91 * 0.0 + fVar86 * 0.0;
    aVar32._12_4_ = auVar45._12_4_ * fVar81 + fVar92 * 0.0 + fVar87 * 0.0;
    auVar45 = vshufps_avx(auVar39,auVar39,0);
    auVar39 = vshufps_avx(auVar39,auVar39,0x55);
    a0.field_0._0_4_ = auVar45._0_4_ * fVar75 + fVar88 * 0.0 + auVar39._0_4_ * fVar82;
    a0.field_0._4_4_ = auVar45._4_4_ * fVar79 + fVar90 * 0.0 + auVar39._4_4_ * fVar85;
    a0.field_0._8_4_ = auVar45._8_4_ * fVar80 + fVar91 * 0.0 + auVar39._8_4_ * fVar86;
    a0.field_0._12_4_ = auVar45._12_4_ * fVar81 + fVar92 * 0.0 + auVar39._12_4_ * fVar87;
    auVar45 = vshufps_avx(auVar38,auVar38,0x55);
    auVar39 = vshufps_avx(auVar38,auVar38,0xaa);
    auVar31 = vshufps_avx(auVar38,auVar38,0);
    auVar38._0_4_ = auVar31._0_4_ * fVar75 + auVar39._0_4_ * fVar88 + auVar45._0_4_ * fVar82;
    auVar38._4_4_ = auVar31._4_4_ * fVar79 + auVar39._4_4_ * fVar90 + auVar45._4_4_ * fVar85;
    auVar38._8_4_ = auVar31._8_4_ * fVar80 + auVar39._8_4_ * fVar91 + auVar45._8_4_ * fVar86;
    auVar38._12_4_ = auVar31._12_4_ * fVar81 + auVar39._12_4_ * fVar92 + auVar45._12_4_ * fVar87;
    auVar45 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
    auVar39 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
    fVar88 = auVar39._0_4_ * fVar82 + auVar45._0_4_ * fVar88;
    fVar82 = auVar39._4_4_ * fVar85 + auVar45._4_4_ * fVar90;
    fVar85 = auVar39._8_4_ * fVar86 + auVar45._8_4_ * fVar91;
    fVar90 = auVar39._12_4_ * fVar87 + auVar45._12_4_ * fVar92;
    auVar39 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0);
    a0_1.field_0 = aVar32;
  }
  else {
    fVar40 = (pGVar2->time_range).lower;
    fVar88 = (pGVar2->time_range).upper;
    auVar26 = ZEXT416((uint)fVar88);
    fVar40 = pGVar2->fnumTimeSegments * (((ray->dir).field_0.m128[3] - fVar40) / (fVar88 - fVar40));
    auVar45 = ZEXT416((uint)fVar40);
    auVar38 = vroundss_avx(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40),9);
    auVar38 = vminss_avx(auVar38,ZEXT416((uint)(pGVar2->fnumTimeSegments + -1.0)));
    auVar54 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar38 = vmaxss_avx(ZEXT816(0) << 0x20,auVar38);
    iVar13 = (int)auVar38._0_4_;
    fVar40 = fVar40 - auVar38._0_4_;
    lVar5 = *(long *)&pGVar2[1].fnumTimeSegments;
    lVar12 = CONCAT44((int)((ulong)prim >> 0x20),iVar13) * 0x38;
    plVar4 = (long *)(lVar5 + lVar12);
    iVar1 = *(int *)(lVar5 + 0x20 + lVar12);
    auVar53 = ZEXT416((uint)fVar40);
    if ((pGVar2->field_8).field_0x1 != '\x01') {
      if (iVar1 == 0x9134) {
        lVar12 = *plVar4;
        lVar15 = plVar4[2] * uVar11;
        auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar15)),
                                ZEXT416(*(uint *)(lVar12 + 0x10 + lVar15)),0x1c);
        auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar15)),0x28);
        auVar38 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar15)),
                                ZEXT416(*(uint *)(lVar12 + 0x14 + lVar15)),0x1c);
        auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar15)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 8 + lVar15)),
                                ZEXT416(*(uint *)(lVar12 + 0x18 + lVar15)),0x1c);
        auVar54 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar15)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                                ZEXT416(*(uint *)(lVar12 + 0x1c + lVar15)),0x1c);
        auVar26 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar15)),0x28);
      }
      else if (iVar1 == 0x9234) {
        lVar12 = *plVar4;
        lVar15 = plVar4[2] * uVar11;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(lVar12 + 4 + lVar15);
        auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + lVar15)),auVar19,0x4c);
        auVar45 = vshufps_avx(auVar45,auVar45,0x78);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar15);
        auVar38 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),auVar44,0x4c);
        auVar38 = vshufps_avx(auVar38,auVar38,0x78);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar15);
        auVar30 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar15)),auVar55,0x4c);
        auVar54 = vshufps_avx(auVar30,auVar30,0x78);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar15);
        uVar10 = *(uint *)(lVar12 + 0x24 + lVar15);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar10);
        auVar30 = vshufps_avx(ZEXT416(uVar10),auVar59,0x4c);
        auVar26 = vshufps_avx(auVar30,auVar30,0x78);
      }
      else if (iVar1 == 0xb001) {
        lVar12 = *plVar4;
        lVar15 = plVar4[2] * uVar11;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar15);
        auVar38 = vinsertps_avx(auVar22,ZEXT416(*(uint *)(lVar12 + 8 + lVar15)),0x20);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar15);
        auVar45 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + lVar15)),auVar23);
        auVar30 = vshufps_avx(auVar45,auVar23,0xd8);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar15);
        auVar45 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar15)),auVar60);
        auVar54 = vshufps_avx(auVar45,auVar60,0xd8);
        fVar88 = *(float *)(lVar12 + 0x24 + lVar15);
        fVar82 = *(float *)(lVar12 + 0x28 + lVar15);
        fVar85 = *(float *)(lVar12 + 0x2c + lVar15);
        auVar39 = ZEXT416((uint)fVar85);
        fVar90 = *(float *)(lVar12 + 0x30 + lVar15);
        auVar31 = ZEXT416((uint)fVar90);
        fVar75 = fVar90 * fVar90 + fVar85 * fVar85 + fVar88 * fVar88 + fVar82 * fVar82;
        auVar45 = vrsqrtss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
        fVar17 = auVar45._0_4_;
        fVar75 = fVar17 * 1.5 + fVar17 * fVar17 * fVar17 * fVar75 * -0.5;
        auVar26 = vinsertps_avx(auVar54,ZEXT416((uint)(fVar75 * fVar88)),0x30);
        auVar45 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar75 * fVar82)),0x30);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar75 * fVar85))
        ;
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                                   ZEXT416(*(uint *)(lVar12 + 4 + lVar15)),0x10);
        auVar54 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar75 * fVar90)),0x30);
        auVar38 = vinsertps_avx((undefined1  [16])a0.field_0,
                                ZEXT416(*(uint *)(lVar12 + 0x3c + lVar15)),0x20);
        auVar38 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar75 * fVar85)),0x30);
      }
      else if (iVar1 == 0x9244) {
        lVar12 = *plVar4;
        lVar15 = plVar4[2] * uVar11;
        auVar45 = *(undefined1 (*) [16])(lVar12 + lVar15);
        auVar38 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar15);
        auVar54 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar15);
        auVar26 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar15);
      }
      lVar12 = (ulong)(iVar13 + 1) * 0x38;
      plVar4 = (long *)(lVar5 + lVar12);
      iVar1 = *(int *)(lVar5 + 0x20 + lVar12);
      if (iVar1 == 0x9134) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x10 + lVar12)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar12)),0x28);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x14 + lVar12)),0x1c);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),0x28);
        auVar31 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),0x1c);
        auVar31 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar12)),0x28);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 0x1c + lVar12)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar12)),0x28);
      }
      else if (iVar1 == 0x9234) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)(lVar5 + 4 + lVar12);
        auVar39 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar67,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar39,auVar39,0x78);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
        auVar39 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),auVar76,0x4c);
        auVar39 = vshufps_avx(auVar39,auVar39,0x78);
        auVar77._8_8_ = 0;
        auVar77._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
        auVar31 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar77,0x4c);
        auVar31 = vshufps_avx(auVar31,auVar31,0x78);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar12);
        auVar30 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),auVar78,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar30,auVar30,0x78);
      }
      else if (iVar1 == 0xb001) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
        auVar39 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),0x20);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar12);
        auVar31 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar69);
        auVar30 = vshufps_avx(auVar31,auVar69,0xd8);
        auVar94._8_8_ = 0;
        auVar94._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
        auVar31 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar94);
        auVar27 = vshufps_avx(auVar31,auVar94,0xd8);
        fVar88 = *(float *)(lVar5 + 0x24 + lVar12);
        fVar82 = *(float *)(lVar5 + 0x28 + lVar12);
        fVar85 = *(float *)(lVar5 + 0x2c + lVar12);
        fVar90 = *(float *)(lVar5 + 0x30 + lVar12);
        fVar75 = fVar90 * fVar90 + fVar85 * fVar85 + fVar88 * fVar88 + fVar82 * fVar82;
        auVar31 = vrsqrtss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
        fVar17 = auVar31._0_4_;
        fVar75 = fVar17 * 1.5 + fVar17 * fVar17 * fVar17 * fVar75 * -0.5;
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar27,ZEXT416((uint)(fVar88 * fVar75)),0x30);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar30,ZEXT416((uint)(fVar82 * fVar75)),0x30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                                ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),0x10);
        auVar31 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar90 * fVar75)),0x30);
        auVar39 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar12)),0x20);
        auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)(fVar85 * fVar75)),0x30);
      }
      else if (iVar1 == 0x9244) {
        lVar5 = *plVar4;
        lVar12 = uVar11 * plVar4[2];
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar12))->v;
        auVar39 = *(undefined1 (*) [16])(lVar5 + 0x10 + lVar12);
        auVar31 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar12);
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x30 + lVar12))->v;
      }
      auVar30 = vshufps_avx(auVar53,auVar53,0);
      fVar90 = auVar30._0_4_;
      fVar75 = auVar30._4_4_;
      fVar17 = auVar30._8_4_;
      fVar79 = auVar30._12_4_;
      auVar30 = vshufps_avx(ZEXT416((uint)(1.0 - fVar40)),ZEXT416((uint)(1.0 - fVar40)),0);
      fVar40 = auVar30._0_4_;
      fVar88 = auVar30._4_4_;
      fVar82 = auVar30._8_4_;
      fVar85 = auVar30._12_4_;
      a0_1.field_0._0_4_ = fVar40 * auVar45._0_4_ + fVar90 * a0.field_0._0_4_;
      a0_1.field_0._4_4_ = fVar88 * auVar45._4_4_ + fVar75 * a0.field_0._4_4_;
      a0_1.field_0._8_4_ = fVar82 * auVar45._8_4_ + fVar17 * a0.field_0._8_4_;
      a0_1.field_0._12_4_ = fVar85 * auVar45._12_4_ + fVar79 * a0.field_0._12_4_;
      a0.field_0._0_4_ = fVar40 * auVar38._0_4_ + fVar90 * auVar39._0_4_;
      a0.field_0._4_4_ = fVar88 * auVar38._4_4_ + fVar75 * auVar39._4_4_;
      a0.field_0._8_4_ = fVar82 * auVar38._8_4_ + fVar17 * auVar39._8_4_;
      a0.field_0._12_4_ = fVar85 * auVar38._12_4_ + fVar79 * auVar39._12_4_;
      auVar38._0_4_ = fVar40 * auVar54._0_4_ + fVar90 * auVar31._0_4_;
      auVar38._4_4_ = fVar88 * auVar54._4_4_ + fVar75 * auVar31._4_4_;
      auVar38._8_4_ = fVar82 * auVar54._8_4_ + fVar17 * auVar31._8_4_;
      auVar38._12_4_ = fVar85 * auVar54._12_4_ + fVar79 * auVar31._12_4_;
      auVar45._0_4_ = fVar40 * auVar26._0_4_ + fVar90 * b0.field_0._0_4_;
      auVar45._4_4_ = fVar88 * auVar26._4_4_ + fVar75 * b0.field_0._4_4_;
      auVar45._8_4_ = fVar82 * auVar26._8_4_ + fVar17 * b0.field_0._8_4_;
      auVar45._12_4_ = fVar85 * auVar26._12_4_ + fVar79 * b0.field_0._12_4_;
      goto LAB_004b1973;
    }
    if (iVar1 == 0x9134) {
      lVar12 = *plVar4;
      lVar15 = plVar4[2] * uVar11;
      uVar10 = *(uint *)(lVar12 + 8 + lVar15);
      auVar45 = ZEXT416(uVar10);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + lVar15)),
                              ZEXT416(*(uint *)(lVar12 + 0x10 + lVar15)),0x1c);
      _local_148 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar12 + 0x20 + lVar15)),0x28);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 4 + lVar15)),
                              ZEXT416(*(uint *)(lVar12 + 0x14 + lVar15)),0x1c);
      _local_158 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar12 + 0x24 + lVar15)),0x28);
      auVar39 = vinsertps_avx(ZEXT416(uVar10),ZEXT416(*(uint *)(lVar12 + 0x18 + lVar15)),0x1c);
      _local_178 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar12 + 0x28 + lVar15)),0x28);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                              ZEXT416(*(uint *)(lVar12 + 0x1c + lVar15)),0x1c);
      _local_168 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar12 + 0x2c + lVar15)),0x28);
    }
    else if (iVar1 == 0x9234) {
      lVar12 = *plVar4;
      lVar15 = plVar4[2] * uVar11;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = *(ulong *)(lVar12 + 4 + lVar15);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + lVar15)),auVar39,0x4c);
      _local_148 = vshufps_avx(auVar45,auVar45,0x78);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar15);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),auVar31,0x4c);
      _local_158 = vshufps_avx(auVar45,auVar45,0x78);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar15);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar15)),auVar26,0x4c);
      _local_178 = vshufps_avx(auVar45,auVar45,0x78);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(lVar12 + 0x28 + lVar15);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar12 + 0x24 + lVar15)),auVar27,0x4c);
      _local_168 = vshufps_avx(auVar45,auVar45,0x78);
      auVar45 = auVar54;
    }
    else if (iVar1 == 0xb001) {
      lVar12 = *plVar4;
      lVar15 = plVar4[2] * uVar11;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(lVar12 + 0x10 + lVar15);
      auVar45 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar12 + 8 + lVar15)),0x20);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(lVar12 + 0x34 + lVar15);
      auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + lVar15)),auVar54);
      auVar31 = vshufps_avx(auVar39,auVar54,0xd8);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(lVar12 + 0x1c + lVar15);
      auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(lVar12 + 0x18 + lVar15)),auVar72);
      auVar38 = vshufps_avx(auVar39,auVar72,0xd8);
      fVar88 = *(float *)(lVar12 + 0x24 + lVar15);
      fVar82 = *(float *)(lVar12 + 0x28 + lVar15);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar82);
      fVar85 = *(float *)(lVar12 + 0x2c + lVar15);
      fVar90 = *(float *)(lVar12 + 0x30 + lVar15);
      fVar75 = fVar90 * fVar90 + fVar85 * fVar85 + fVar88 * fVar88 + fVar82 * fVar82;
      auVar39 = vrsqrtss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
      fVar17 = auVar39._0_4_;
      auVar30 = ZEXT416((uint)(fVar17 * fVar17));
      fVar75 = fVar17 * 1.5 + fVar17 * fVar17 * fVar17 * fVar75 * -0.5;
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar75 * fVar88));
      _local_168 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar75 * fVar88)),0x30);
      _local_148 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar75 * fVar82)),0x30);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar12 + 0xc + lVar15)),
                              ZEXT416(*(uint *)(lVar12 + 4 + lVar15)),0x10);
      _local_178 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar75 * fVar90)),0x30);
      auVar45 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar12 + 0x3c + lVar15)),0x20);
      _local_158 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar75 * fVar85)),0x30);
      auVar45 = ZEXT416((uint)(fVar75 * fVar90));
    }
    else {
      auVar45 = ZEXT816(0) << 0x20;
      if (iVar1 == 0x9244) {
        lVar12 = *plVar4;
        lVar15 = plVar4[2] * uVar11;
        _local_148 = *(undefined1 (*) [16])(lVar12 + lVar15);
        _local_158 = *(undefined1 (*) [16])(lVar12 + 0x10 + lVar15);
        _local_178 = *(undefined1 (*) [16])(lVar12 + 0x20 + lVar15);
        _local_168 = *(undefined1 (*) [16])(lVar12 + 0x30 + lVar15);
        auVar45 = auVar54;
      }
    }
    lVar12 = (ulong)(iVar13 + 1) * 0x38;
    plVar4 = (long *)(lVar5 + lVar12);
    iVar1 = *(int *)(lVar5 + 0x20 + lVar12);
    if (iVar1 == 0x9134) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x10 + lVar12)),0x1c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x20 + lVar12)),0x28);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x14 + lVar12)),0x1c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),0x28);
      auVar45 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),0x1c);
      auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(lVar5 + 0x28 + lVar12)),0x28);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 0x1c + lVar12)),0x1c);
      auVar30 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar5 + 0x2c + lVar12)),0x28);
    }
    else if (iVar1 == 0x9234) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(lVar5 + 4 + lVar12);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar33,0x4c);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar45,auVar45,0x78);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),auVar34,0x4c);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar45,auVar45,0x78);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
      auVar45 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar35,0x4c);
      auVar45 = vshufps_avx(auVar45,auVar45,0x78);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar5 + 0x28 + lVar12);
      auVar39 = vshufps_avx(ZEXT416(*(uint *)(lVar5 + 0x24 + lVar12)),auVar36,0x4c);
      auVar30 = vshufps_avx(auVar39,auVar39,0x78);
    }
    else if (iVar1 == 0xb001) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(lVar5 + 0x10 + lVar12);
      auVar45 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(lVar5 + 8 + lVar12)),0x20);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)(lVar5 + 0x34 + lVar12);
      auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + lVar12)),auVar51);
      auVar31 = vshufps_avx(auVar39,auVar51,0xd8);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *(ulong *)(lVar5 + 0x1c + lVar12);
      auVar39 = vmovlhps_avx(ZEXT416(*(uint *)(lVar5 + 0x18 + lVar12)),auVar73);
      auVar38 = vshufps_avx(auVar39,auVar73,0xd8);
      fVar88 = *(float *)(lVar5 + 0x24 + lVar12);
      fVar82 = *(float *)(lVar5 + 0x28 + lVar12);
      fVar85 = *(float *)(lVar5 + 0x2c + lVar12);
      fVar90 = *(float *)(lVar5 + 0x30 + lVar12);
      fVar75 = fVar90 * fVar90 + fVar85 * fVar85 + fVar88 * fVar88 + fVar82 * fVar82;
      auVar39 = vrsqrtss_avx(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
      fVar17 = auVar39._0_4_;
      fVar75 = fVar17 * 1.5 + fVar17 * fVar17 * fVar17 * fVar75 * -0.5;
      auVar30 = vinsertps_avx(auVar38,ZEXT416((uint)(fVar75 * fVar88)),0x30);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar31,ZEXT416((uint)(fVar75 * fVar82)),0x30);
      auVar39 = vinsertps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar12)),
                              ZEXT416(*(uint *)(lVar5 + 4 + lVar12)),0x10);
      auVar45 = vinsertps_avx(auVar45,ZEXT416((uint)(fVar75 * fVar90)),0x30);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(lVar5 + 0x3c + lVar12)),0x20);
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar39,ZEXT416((uint)(fVar75 * fVar85)),0x30);
    }
    else if (iVar1 == 0x9244) {
      lVar5 = *plVar4;
      lVar12 = uVar11 * plVar4[2];
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + lVar12))->v;
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar5 + 0x10 + lVar12))->v;
      auVar45 = *(undefined1 (*) [16])(lVar5 + 0x20 + lVar12);
      auVar30 = *(undefined1 (*) [16])(lVar5 + 0x30 + lVar12);
    }
    auVar31 = vpermilps_avx(_local_168,0xff);
    auVar38 = vpermilps_avx(_local_148,0xff);
    auVar54 = vpermilps_avx(_local_158,0xff);
    auVar26 = vpermilps_avx(_local_178,0xff);
    local_118 = vshufps_avx(auVar30,auVar30,0xff);
    local_108 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
    auVar39 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
    local_d8 = vshufps_avx(auVar45,auVar45,0xff);
    fVar82 = auVar38._0_4_;
    fVar85 = auVar31._0_4_;
    fVar90 = auVar54._0_4_;
    fVar75 = auVar26._0_4_;
    fVar88 = fVar75 * local_d8._0_4_ +
             fVar90 * auVar39._0_4_ + fVar85 * local_118._0_4_ + fVar82 * local_108._0_4_;
    auVar52._0_4_ = -fVar88;
    auVar52._4_4_ = 0x80000000;
    auVar52._8_4_ = 0x80000000;
    auVar52._12_4_ = 0x80000000;
    auVar63._0_8_ = local_d8._0_8_ ^ 0x8000000080000000;
    auVar63._8_4_ = local_d8._8_4_ ^ 0x80000000;
    auVar63._12_4_ = local_d8._12_4_ ^ 0x80000000;
    if (fVar88 < auVar52._0_4_) {
      local_118._0_8_ = local_118._0_8_ ^ 0x8000000080000000;
      local_118._8_4_ = local_118._8_4_ ^ 0x80000000;
      local_118._12_4_ = local_118._12_4_ ^ 0x80000000;
      local_108._0_8_ = local_108._0_8_ ^ 0x8000000080000000;
      local_108._8_4_ = local_108._8_4_ ^ 0x80000000;
      local_108._12_4_ = local_108._12_4_ ^ 0x80000000;
      local_d8 = auVar63;
    }
    auVar57._8_4_ = 0x7fffffff;
    auVar57._0_8_ = 0x7fffffff7fffffff;
    auVar57._12_4_ = 0x7fffffff;
    auVar38 = ZEXT416((uint)fVar88);
    auVar31 = vandps_avx(auVar38,auVar57);
    fVar79 = auVar31._0_4_;
    uStack_120 = auVar39._8_4_;
    uStack_11c = auVar39._12_4_;
    auVar31 = vcmpss_avx(auVar38,auVar52,1);
    auVar38 = vmaxss_avx(auVar52,auVar38);
    fVar17 = auVar38._0_4_;
    fVar88 = 1.0 - fVar79;
    if (fVar88 < 0.0) {
      fVar88 = sqrtf(fVar88);
    }
    else {
      auVar38 = vsqrtss_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88));
      fVar88 = auVar38._0_4_;
    }
    auVar9._8_4_ = uStack_120 ^ 0x80000000;
    auVar9._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
    auVar9._12_4_ = uStack_11c ^ 0x80000000;
    auVar39 = vblendvps_avx(auVar39,auVar9,auVar31);
    auVar38 = vmaxss_avx(ZEXT816(0) << 0x40,
                         ZEXT416((uint)(1.5707964 -
                                       fVar88 * (fVar79 * (fVar79 * (fVar79 * (fVar79 * (fVar79 * 
                                                  -0.0043095737 + 0.0192803) + -0.04489909) +
                                                  0.08785567) + -0.21450998) + 1.5707952))));
    auVar64._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    auVar64._8_4_ = auVar38._8_4_ ^ 0x80000000;
    auVar64._12_4_ = auVar38._12_4_ ^ 0x80000000;
    auVar31 = vcmpss_avx(ZEXT416((uint)fVar17),ZEXT816(0) << 0x40,1);
    auVar31 = vblendvps_avx(auVar38,auVar64,auVar31);
    auVar38 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar79),1);
    auVar74._8_4_ = 0x7fc00000;
    auVar74._0_8_ = 0x7fc000007fc00000;
    auVar74._12_4_ = 0x7fc00000;
    auVar31 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar31._0_4_)),auVar74,auVar38);
    fVar80 = auVar31._0_4_ * fVar40;
    auVar31 = ZEXT416((uint)(fVar80 * 0.63661975));
    auVar31 = vroundss_avx(auVar31,auVar31,9);
    uVar14 = (uint)auVar31._0_4_;
    fVar80 = fVar80 - auVar31._0_4_ * 1.5707964;
    fVar79 = fVar80 * fVar80;
    uVar10 = uVar14 & 3;
    fVar88 = fVar79 * (fVar79 * (fVar79 * (fVar79 * (fVar79 * -2.5963018e-07 + 2.4756235e-05) +
                                          -0.001388833) + 0.04166664) + -0.5) + 1.0;
    fVar80 = fVar80 * (fVar79 * (fVar79 * (fVar79 * (fVar79 * (fVar79 * -2.5029328e-08 +
                                                              2.7600126e-06) + -0.00019842605) +
                                          0.008333348) + -0.16666667) + 1.0);
    fVar79 = fVar88;
    if ((uVar14 & 1) != 0) {
      fVar79 = fVar80;
      fVar80 = fVar88;
    }
    if (uVar10 - 1 < 2) {
      fVar79 = -fVar79;
    }
    fVar81 = fVar17 * fVar85 - (float)local_118._0_4_;
    fVar91 = fVar17 * fVar82 - (float)local_108._0_4_;
    fVar92 = fVar17 * fVar90 - auVar39._0_4_;
    fVar93 = fVar17 * fVar75 - (float)local_d8._0_4_;
    fVar88 = fVar93 * fVar93 + fVar92 * fVar92 + fVar81 * fVar81 + fVar91 * fVar91;
    auVar31 = vrsqrtss_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88));
    fVar95 = auVar31._0_4_;
    fVar88 = fVar95 * 1.5 + fVar95 * fVar95 * fVar95 * fVar88 * -0.5;
    if (uVar10 < 2) {
      fVar80 = -fVar80;
    }
    fVar8 = 1.0 - fVar40;
    fVar86 = fVar8 * fVar85 + fVar40 * (float)local_118._0_4_;
    fVar87 = fVar8 * fVar82 + fVar40 * (float)local_108._0_4_;
    fVar6 = fVar90 * fVar8 + fVar40 * auVar39._0_4_;
    fVar40 = fVar75 * fVar8 + fVar40 * (float)local_d8._0_4_;
    fVar95 = fVar40 * fVar40 + fVar6 * fVar6 + fVar86 * fVar86 + fVar87 * fVar87;
    auVar39 = vrsqrtss_avx(ZEXT416((uint)fVar95),ZEXT416((uint)fVar95));
    fVar96 = auVar39._0_4_;
    fVar95 = fVar96 * 1.5 + fVar96 * fVar96 * fVar96 * fVar95 * -0.5;
    if (0.9995 < fVar17) {
      fVar86 = fVar86 * fVar95;
      fVar87 = fVar87 * fVar95;
      fVar6 = fVar6 * fVar95;
    }
    else {
      fVar86 = fVar79 * fVar85 + fVar88 * fVar81 * fVar80;
      fVar87 = fVar79 * fVar82 + fVar88 * fVar91 * fVar80;
      fVar6 = fVar90 * fVar79 + fVar88 * fVar92 * fVar80;
    }
    auVar39 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar17),1);
    auVar39 = vblendvps_avx(ZEXT416((uint)(fVar75 * fVar79 + fVar88 * fVar93 * fVar80)),
                            ZEXT416((uint)(fVar95 * fVar40)),auVar39);
    auVar31 = vpermilps_avx(auVar53,0);
    local_48 = a0.field_0._0_4_;
    fStack_44 = a0.field_0._4_4_;
    fStack_40 = a0.field_0._8_4_;
    fStack_3c = a0.field_0._12_4_;
    fVar40 = auVar31._0_4_;
    fVar88 = auVar31._4_4_;
    fVar82 = auVar31._8_4_;
    fVar85 = auVar31._12_4_;
    auVar31 = vshufps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),0);
    fVar90 = auVar31._0_4_;
    fVar75 = auVar31._4_4_;
    fVar17 = auVar31._8_4_;
    fVar79 = auVar31._12_4_;
    local_198._4_4_ = fVar75 * (float)local_148._4_4_ + fVar88 * fStack_44;
    local_198._0_4_ = fVar90 * (float)local_148._0_4_ + fVar40 * local_48;
    uStack_190._0_4_ = fVar17 * fStack_140 + fVar82 * fStack_40;
    uStack_190._4_4_ = fVar79 * fStack_13c + fVar85 * fStack_3c;
    local_58 = b0.field_0._0_4_;
    fStack_54 = b0.field_0._4_4_;
    fStack_50 = b0.field_0._8_4_;
    fStack_4c = b0.field_0._12_4_;
    auVar65._0_4_ = fVar90 * (float)local_158._0_4_ + fVar40 * local_58;
    auVar65._4_4_ = fVar75 * (float)local_158._4_4_ + fVar88 * fStack_54;
    auVar65._8_4_ = fVar17 * fStack_150 + fVar82 * fStack_50;
    auVar65._12_4_ = fVar79 * fStack_14c + fVar85 * fStack_4c;
    local_78 = auVar45._0_4_;
    fStack_74 = auVar45._4_4_;
    fStack_70 = auVar45._8_4_;
    fStack_6c = auVar45._12_4_;
    auVar58._0_4_ = fVar90 * (float)local_178._0_4_ + fVar40 * local_78;
    auVar58._4_4_ = fVar75 * (float)local_178._4_4_ + fVar88 * fStack_74;
    auVar58._8_4_ = fVar17 * fStack_170 + fVar82 * fStack_70;
    auVar58._12_4_ = fVar79 * fStack_16c + fVar85 * fStack_6c;
    local_68 = auVar30._0_4_;
    fStack_64 = auVar30._4_4_;
    fStack_60 = auVar30._8_4_;
    fStack_5c = auVar30._12_4_;
    auVar53._0_4_ = fVar90 * (float)local_168._0_4_ + fVar40 * local_68;
    auVar53._4_4_ = fVar75 * (float)local_168._4_4_ + fVar88 * fStack_64;
    auVar53._8_4_ = fVar17 * fStack_160 + fVar82 * fStack_60;
    auVar53._12_4_ = fVar79 * fStack_15c + fVar85 * fStack_5c;
    fVar93 = auVar39._0_4_;
    fVar40 = fVar87 * fVar6 + fVar93 * fVar86;
    fVar85 = fVar87 * fVar6 - fVar93 * fVar86;
    fVar90 = fVar86 * fVar86 - fVar87 * fVar87;
    fVar75 = fVar93 * fVar87 - fVar86 * fVar6;
    fVar88 = fVar93 * fVar87 + fVar86 * fVar6;
    fVar82 = fVar93 * fVar6 + fVar86 * fVar87;
    fVar17 = fVar93 * fVar6 - fVar86 * fVar87;
    auVar45 = ZEXT416((uint)(-fVar93 * fVar93 + -fVar6 * fVar6 + fVar86 * fVar86 + fVar87 * fVar87))
    ;
    auVar45 = vshufps_avx(auVar45,auVar45,0);
    auVar39 = ZEXT416((uint)(fVar40 + fVar40));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar31 = ZEXT416((uint)(fVar75 + fVar75));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    fVar75 = auVar45._0_4_ * 1.0 + auVar39._0_4_ * 0.0 + auVar31._0_4_ * 0.0;
    fVar79 = auVar45._4_4_ * 0.0 + auVar39._4_4_ * 1.0 + auVar31._4_4_ * 0.0;
    fVar80 = auVar45._8_4_ * 0.0 + auVar39._8_4_ * 0.0 + auVar31._8_4_ * 1.0;
    fVar81 = auVar45._12_4_ * 0.0 + auVar39._12_4_ * 0.0 + auVar31._12_4_ * 0.0;
    auVar45 = ZEXT416((uint)(-fVar93 * fVar93 + fVar6 * fVar6 + fVar90));
    auVar45 = vshufps_avx(auVar45,auVar45,0);
    auVar39 = ZEXT416((uint)(fVar82 + fVar82));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar31 = ZEXT416((uint)(fVar85 + fVar85));
    auVar31 = vshufps_avx(auVar31,auVar31,0);
    fVar82 = auVar31._0_4_ * 1.0 + auVar39._0_4_ * 0.0 + auVar45._0_4_ * 0.0;
    fVar85 = auVar31._4_4_ * 0.0 + auVar39._4_4_ * 0.0 + auVar45._4_4_ * 1.0;
    fVar91 = auVar31._8_4_ * 0.0 + auVar39._8_4_ * 1.0 + auVar45._8_4_ * 0.0;
    fVar92 = auVar31._12_4_ * 0.0 + auVar39._12_4_ * 0.0 + auVar45._12_4_ * 0.0;
    auVar45 = ZEXT416((uint)(fVar93 * fVar93 + -fVar6 * fVar6 + fVar90));
    auVar39 = vshufps_avx(auVar45,auVar45,0);
    auVar45 = ZEXT416((uint)(fVar17 + fVar17));
    auVar31 = vshufps_avx(auVar45,auVar45,0);
    auVar45 = ZEXT416((uint)(fVar88 + fVar88));
    auVar38 = vshufps_avx(auVar45,auVar45,0);
    auVar45 = vshufps_avx(_local_198,ZEXT416(0) << 0x20,0xe9);
    auVar45 = vblendps_avx(auVar45,auVar65,4);
    fVar88 = auVar38._0_4_ * 1.0 + auVar31._0_4_ * 0.0 + auVar39._0_4_ * 0.0;
    fVar90 = auVar38._4_4_ * 0.0 + auVar31._4_4_ * 1.0 + auVar39._4_4_ * 0.0;
    fVar86 = auVar38._8_4_ * 0.0 + auVar31._8_4_ * 0.0 + auVar39._8_4_ * 1.0;
    fVar87 = auVar38._12_4_ * 0.0 + auVar31._12_4_ * 0.0 + auVar39._12_4_ * 0.0;
    fVar17 = auVar45._0_4_;
    fVar93 = auVar45._4_4_;
    fVar95 = auVar45._8_4_;
    fVar40 = auVar45._12_4_;
    auVar45 = vshufps_avx(_local_198,_local_198,0);
    a0_1.field_0._0_4_ = auVar45._0_4_ * fVar75 + fVar82 * 0.0 + fVar88 * 0.0;
    a0_1.field_0._4_4_ = auVar45._4_4_ * fVar79 + fVar85 * 0.0 + fVar90 * 0.0;
    a0_1.field_0._8_4_ = auVar45._8_4_ * fVar80 + fVar91 * 0.0 + fVar86 * 0.0;
    a0_1.field_0._12_4_ = auVar45._12_4_ * fVar81 + fVar92 * 0.0 + fVar87 * 0.0;
    auVar45 = vshufps_avx(auVar65,auVar65,0);
    auVar39 = vshufps_avx(auVar65,auVar65,0x55);
    a0.field_0._0_4_ = auVar45._0_4_ * fVar75 + auVar39._0_4_ * fVar82 + fVar88 * 0.0;
    a0.field_0._4_4_ = auVar45._4_4_ * fVar79 + auVar39._4_4_ * fVar85 + fVar90 * 0.0;
    a0.field_0._8_4_ = auVar45._8_4_ * fVar80 + auVar39._8_4_ * fVar91 + fVar86 * 0.0;
    a0.field_0._12_4_ = auVar45._12_4_ * fVar81 + auVar39._12_4_ * fVar92 + fVar87 * 0.0;
    auVar45 = vshufps_avx(auVar58,auVar58,0x55);
    auVar39 = vshufps_avx(auVar58,auVar58,0xaa);
    auVar31 = vshufps_avx(auVar58,auVar58,0);
    auVar38._0_4_ = auVar31._0_4_ * fVar75 + auVar45._0_4_ * fVar82 + fVar88 * auVar39._0_4_;
    auVar38._4_4_ = auVar31._4_4_ * fVar79 + auVar45._4_4_ * fVar85 + fVar90 * auVar39._4_4_;
    auVar38._8_4_ = auVar31._8_4_ * fVar80 + auVar45._8_4_ * fVar91 + fVar86 * auVar39._8_4_;
    auVar38._12_4_ = auVar31._12_4_ * fVar81 + auVar45._12_4_ * fVar92 + fVar87 * auVar39._12_4_;
    auVar45 = vshufps_avx(auVar53,auVar53,0xaa);
    auVar39 = vshufps_avx(auVar53,auVar53,0x55);
    fVar88 = auVar39._0_4_ * fVar82 + fVar88 * auVar45._0_4_;
    fVar82 = auVar39._4_4_ * fVar85 + fVar90 * auVar45._4_4_;
    fVar85 = auVar39._8_4_ * fVar91 + fVar86 * auVar45._8_4_;
    fVar90 = auVar39._12_4_ * fVar92 + fVar87 * auVar45._12_4_;
    auVar39 = vshufps_avx(auVar53,auVar53,0);
  }
  auVar45._0_4_ = fVar17 + 0.0 + auVar39._0_4_ * fVar75 + fVar88;
  auVar45._4_4_ = fVar93 + 0.0 + auVar39._4_4_ * fVar79 + fVar82;
  auVar45._8_4_ = fVar95 + 0.0 + auVar39._8_4_ * fVar80 + fVar85;
  auVar45._12_4_ = fVar40 + 0.0 + auVar39._12_4_ * fVar81 + fVar90;
LAB_004b1973:
  auVar39 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar31 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar83._0_4_ = auVar38._0_4_ * auVar31._0_4_;
  auVar83._4_4_ = auVar38._4_4_ * auVar31._4_4_;
  auVar83._8_4_ = auVar38._8_4_ * auVar31._8_4_;
  auVar83._12_4_ = auVar38._12_4_ * auVar31._12_4_;
  auVar89._0_4_ = a0.field_0._0_4_ * auVar39._0_4_;
  auVar89._4_4_ = a0.field_0._4_4_ * auVar39._4_4_;
  auVar89._8_4_ = a0.field_0._8_4_ * auVar39._8_4_;
  auVar89._12_4_ = a0.field_0._12_4_ * auVar39._12_4_;
  auVar26 = vsubps_avx(auVar89,auVar83);
  auVar30 = vshufps_avx(auVar26,auVar26,0xc9);
  auVar54 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
  auVar61._0_4_ = auVar39._0_4_ * a0_1.field_0._0_4_;
  auVar61._4_4_ = auVar39._4_4_ * a0_1.field_0._4_4_;
  auVar61._8_4_ = auVar39._8_4_ * a0_1.field_0._8_4_;
  auVar61._12_4_ = auVar39._12_4_ * a0_1.field_0._12_4_;
  auVar56._0_4_ = auVar54._0_4_ * auVar38._0_4_;
  auVar56._4_4_ = auVar54._4_4_ * auVar38._4_4_;
  auVar56._8_4_ = auVar54._8_4_ * auVar38._8_4_;
  auVar56._12_4_ = auVar54._12_4_ * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar56,auVar61);
  auVar62._0_4_ = auVar54._0_4_ * a0.field_0._0_4_;
  auVar62._4_4_ = auVar54._4_4_ * a0.field_0._4_4_;
  auVar62._8_4_ = auVar54._8_4_ * a0.field_0._8_4_;
  auVar62._12_4_ = auVar54._12_4_ * a0.field_0._12_4_;
  auVar70._0_4_ = a0_1.field_0._0_4_ * auVar31._0_4_;
  auVar70._4_4_ = a0_1.field_0._4_4_ * auVar31._4_4_;
  auVar70._8_4_ = a0_1.field_0._8_4_ * auVar31._8_4_;
  auVar70._12_4_ = a0_1.field_0._12_4_ * auVar31._12_4_;
  auVar31 = vsubps_avx(auVar70,auVar62);
  auVar39 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar54 = vunpcklps_avx(auVar30,auVar39);
  auVar26 = vunpcklps_avx(auVar26,auVar31);
  auVar31 = vinsertps_avx(auVar38,auVar38,0x4a);
  auVar39 = vdpps_avx((undefined1  [16])a0_1.field_0,auVar30,0x7f);
  auVar30 = vunpcklps_avx(auVar26,ZEXT416(auVar38._0_4_));
  auVar26 = vunpcklps_avx(auVar54,auVar31);
  auVar31 = vunpckhps_avx(auVar54,auVar31);
  auVar38 = vshufps_avx(auVar39,auVar39,0);
  auVar39 = vdivps_avx(auVar26,auVar38);
  auVar31 = vdivps_avx(auVar31,auVar38);
  auVar38 = vdivps_avx(auVar30,auVar38);
  auVar30 = vshufps_avx(auVar45,auVar45,0);
  auVar54 = vshufps_avx(auVar45,auVar45,0x55);
  auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
  fVar85 = auVar38._0_4_;
  fVar17 = auVar38._4_4_;
  fVar81 = auVar38._8_4_;
  fVar93 = auVar38._12_4_;
  fVar90 = auVar31._0_4_;
  fVar79 = auVar31._4_4_;
  fVar91 = auVar31._8_4_;
  fVar95 = auVar31._12_4_;
  fVar75 = auVar39._0_4_;
  fVar80 = auVar39._4_4_;
  fVar92 = auVar39._8_4_;
  fVar86 = auVar39._12_4_;
  auVar46._0_4_ = auVar30._0_4_ * fVar75 + auVar54._0_4_ * fVar90 + auVar45._0_4_ * fVar85;
  auVar46._4_4_ = auVar30._4_4_ * fVar80 + auVar54._4_4_ * fVar79 + auVar45._4_4_ * fVar17;
  auVar46._8_4_ = auVar30._8_4_ * fVar92 + auVar54._8_4_ * fVar91 + auVar45._8_4_ * fVar81;
  auVar46._12_4_ = auVar30._12_4_ * fVar86 + auVar54._12_4_ * fVar95 + auVar45._12_4_ * fVar93;
  auVar45 = *(undefined1 (*) [16])(ray->org).field_0.m128;
  auVar39 = *(undefined1 (*) [16])(ray->dir).field_0.m128;
  fVar40 = (ray->org).field_0.m128[0];
  fVar88 = (ray->org).field_0.m128[1];
  fVar82 = (ray->org).field_0.m128[2];
  auVar84._0_4_ = fVar82 * fVar85;
  auVar84._4_4_ = fVar82 * fVar17;
  auVar84._8_4_ = fVar82 * fVar81;
  auVar84._12_4_ = fVar82 * fVar93;
  auVar31 = vsubps_avx(auVar84,auVar46);
  auVar47._0_4_ = fVar40 * fVar75 + fVar88 * fVar90 + auVar31._0_4_;
  auVar47._4_4_ = fVar40 * fVar80 + fVar88 * fVar79 + auVar31._4_4_;
  auVar47._8_4_ = fVar40 * fVar92 + fVar88 * fVar91 + auVar31._8_4_;
  auVar47._12_4_ = fVar40 * fVar86 + fVar88 * fVar95 + auVar31._12_4_;
  aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar47,auVar45,8);
  (ray->org).field_0 = aVar7;
  fVar40 = (ray->dir).field_0.m128[0];
  fVar88 = (ray->dir).field_0.m128[1];
  fVar82 = (ray->dir).field_0.m128[2];
  auVar24._0_4_ = fVar40 * fVar75 + fVar88 * fVar90 + fVar82 * fVar85;
  auVar24._4_4_ = fVar40 * fVar80 + fVar88 * fVar79 + fVar82 * fVar17;
  auVar24._8_4_ = fVar40 * fVar92 + fVar88 * fVar91 + fVar82 * fVar81;
  auVar24._12_4_ = fVar40 * fVar86 + fVar88 * fVar95 + fVar82 * fVar93;
  aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vblendps_avx(auVar24,auVar39,8);
  (ray->dir).field_0 = aVar7;
  (**(code **)(p_Var16 + 0x80))(p_Var16 + 0x58,ray);
  local_198 = auVar45._0_8_;
  uStack_190 = auVar45._8_8_;
  *(undefined1 (*) [8])&(ray->org).field_0 = local_198;
  *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_190;
  local_138 = auVar39._0_8_;
  uStack_130 = auVar39._8_8_;
  *(undefined8 *)&(ray->dir).field_0 = local_138;
  *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_130;
  fVar40 = ray->tfar;
  pRVar3->instID[0] = 0xffffffff;
  pRVar3->instPrimID[0] = 0xffffffff;
  return fVar40 < 0.0;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }